

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode Curl_hsts_loadfile(Curl_easy *data,hsts *h,char *file)

{
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  stsentry *psVar6;
  time_t expires;
  dynbuf buf;
  char local_188 [80];
  char host [257];
  
  (*Curl_cfree)(h->filename);
  pcVar4 = (*Curl_cstrdup)(file);
  h->filename = pcVar4;
  if (pcVar4 == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    __stream = fopen64(file,"r");
    if (__stream != (FILE *)0x0) {
      Curl_dyn_init(&buf,0xfff);
      do {
        do {
          iVar2 = Curl_get_line(&buf,(FILE *)__stream);
          if (iVar2 == 0) {
            Curl_dyn_free(&buf);
            fclose(__stream);
            goto LAB_0012fcca;
          }
          for (pcVar4 = Curl_dyn_ptr(&buf); (cVar1 = *pcVar4, cVar1 == '\t' || (cVar1 == ' '));
              pcVar4 = pcVar4 + 1) {
          }
        } while ((cVar1 == '#') || (sVar5 = strlen(pcVar4), sVar5 < 2));
        iVar2 = __isoc99_sscanf(pcVar4,"%256s \"%64[^\"]\"",host,local_188);
        if (iVar2 == 2) {
          iVar2 = bcmp(local_188,"unlimited",10);
          expires = 0x7fffffffffffffff;
          if (iVar2 != 0) {
            expires = Curl_getdate_capped(local_188);
          }
          cVar1 = host[0];
          pcVar4 = host + (host[0] == '.');
          psVar6 = Curl_hsts(h,pcVar4,host[0] == '.');
          if (psVar6 == (stsentry *)0x0) {
            hsts_create(h,pcVar4,cVar1 == '.',expires);
          }
          else {
            iVar2 = curl_strequal(pcVar4,psVar6->host);
            if ((iVar2 != 0) && (psVar6->expires < expires)) {
              psVar6->expires = expires;
            }
          }
        }
      } while( true );
    }
LAB_0012fcca:
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_hsts_loadfile(struct Curl_easy *data,
                            struct hsts *h, const char *file)
{
  DEBUGASSERT(h);
  (void)data;
  return hsts_load(h, file);
}